

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp3.c
# Opt level: O3

int dooptions(Global *global,fppTag *tags)

{
  SIZES *pSVar1;
  char ***pppcVar2;
  char cVar3;
  char **ppcVar4;
  char *pcVar5;
  DEFBUF *pDVar6;
  ushort **ppuVar7;
  char *pcVar8;
  short sVar9;
  int iVar10;
  void *pvVar11;
  SIZES *pSVar12;
  ErrorCode EVar13;
  char *text;
  byte *pbVar14;
  ulong uVar15;
  byte bVar16;
  
  if (tags == (fppTag *)0x0) {
    iVar10 = 0;
switchD_00103c2f_caseD_0:
    return iVar10;
  }
  pppcVar2 = &global->incend;
  do {
    iVar10 = tags->tag;
    switch(iVar10) {
    case 0:
      goto switchD_00103c2f_caseD_0;
    case 1:
      if (tags->data != (void *)0x0) {
        global->keepcomments = '\x01';
        global->cflag = '\x01';
      }
      break;
    case 2:
      pcVar8 = (char *)tags->data;
      text = pcVar8;
      do {
        pcVar5 = text;
        text = pcVar5 + 1;
        if (*pcVar5 == '\0') {
          text = "1";
          goto LAB_00103fad;
        }
      } while (*pcVar5 != '=');
      *pcVar5 = '\0';
LAB_00103fad:
      pDVar6 = defendel(global,pcVar8,0);
      if (pDVar6 == (DEFBUF *)0x0) {
        return 1;
      }
      pcVar8 = savestring(global,text);
      pDVar6->repl = pcVar8;
      pDVar6->nargs = -1;
      break;
    case 3:
      global->eflag = '\x01';
      break;
    case 4:
      ppcVar4 = *pppcVar2;
      if (pppcVar2 <= ppcVar4) {
        iVar10 = 0x11;
        EVar13 = FATAL_TOO_MANY_INCLUDE_DIRS;
LAB_00104014:
        cerror(global,EVar13);
        return iVar10;
      }
      pcVar8 = (char *)tags->data;
      *pppcVar2 = ppcVar4 + 1;
      *ppcVar4 = pcVar8;
      break;
    case 5:
      bVar16 = tags->data != (void *)0x0;
      goto LAB_00103e80;
    case 6:
      bVar16 = (tags->data != (void *)0x0) * '\x02';
LAB_00103e80:
      global->nflag = global->nflag | bVar16;
      break;
    case 7:
      global->cplusplus = tags->data == (void *)0x0;
      break;
    case 8:
      cVar3 = *tags->data;
      iVar10 = (uint)(cVar3 != '*') << 9;
      pbVar14 = (byte *)((long)tags->data + (ulong)(cVar3 == '*'));
      pSVar12 = size_table;
      if (iVar10 != size_table[0].bits) {
        do {
          bVar16 = *pbVar14;
          if (bVar16 == 0) {
LAB_00103fd8:
            cerror(global,WARN_TOO_FEW_VALUES_TO_SIZEOF,0);
            goto LAB_00103fee;
          }
          ppuVar7 = __ctype_b_loc();
          while (uVar15 = (ulong)bVar16,
                (*(byte *)((long)*ppuVar7 + (long)(char)bVar16 * 2 + 1) & 8) == 0) {
            bVar16 = pbVar14[1];
            pbVar14 = pbVar14 + 1;
            if (bVar16 == 0) goto LAB_00103fd8;
          }
          sVar9 = 0;
          do {
            sVar9 = (short)(char)uVar15 + sVar9 * 10 + -0x30;
            uVar15 = (ulong)(char)pbVar14[1];
            pbVar14 = pbVar14 + 1;
          } while ((*(byte *)((long)*ppuVar7 + uVar15 * 2 + 1) & 8) != 0);
          (&pSVar12->size)[cVar3 == '*'] = sVar9;
          pSVar1 = pSVar12 + 1;
          pSVar12 = pSVar12 + 1;
        } while (iVar10 != pSVar1->bits);
      }
      if (*pbVar14 != 0) {
        EVar13 = WARN_TOO_MANY_VALUES_TO_SIZEOF;
        goto LAB_00103f07;
      }
      break;
    case 9:
      pDVar6 = defendel(global,(char *)tags->data,1);
      if (pDVar6 == (DEFBUF *)0x0) {
        pvVar11 = tags->data;
        EVar13 = WARN_NOT_DEFINED;
        goto LAB_00103f09;
      }
      break;
    case 10:
      global->wflag = global->wflag + '\x01';
      break;
    case 0xb:
      strcpy(global->work,(char *)tags->data);
      global->first_file = (char *)tags->data;
      break;
    case 0xc:
      global->input = (_func_char_ptr_char_ptr_int_void_ptr *)tags->data;
      break;
    case 0xd:
      global->output = (_func_void_int_void_ptr *)tags->data;
      break;
    case 0xe:
      global->userdata = tags->data;
      break;
    case 0xf:
      global->linelines = tags->data != (void *)0x0;
      break;
    case 0x10:
      global->error = (_func_void_void_ptr_char_ptr___va_list_tag_ptr *)tags->data;
      break;
    case 0x11:
      global->warnillegalcpp = tags->data != (void *)0x0;
      break;
    case 0x12:
      global->outputLINE = tags->data != (void *)0x0;
      break;
    case 0x13:
      global->showversion = tags->data == (void *)0x0;
      break;
    case 0x14:
      global->showincluded = tags->data != (void *)0x0;
      break;
    case 0x15:
      global->showbalance = tags->data != (void *)0x0;
      break;
    case 0x16:
      global->showspace = tags->data != (void *)0x0;
      break;
    case 0x17:
      global->nestcomments = tags->data != (void *)0x0;
      break;
    case 0x18:
      global->warnnestcomments = tags->data != (void *)0x0;
      break;
    case 0x19:
      global->warnnoinclude = tags->data != (void *)0x0;
      break;
    case 0x1a:
      global->outputfile = tags->data != (void *)0x0;
      break;
    case 0x1b:
    case 0x1c:
      uVar15 = (ulong)global->included;
      if (0x13 < uVar15) {
        iVar10 = 0x12;
        EVar13 = FATAL_TOO_MANY_INCLUDE_FILES;
        goto LAB_00104014;
      }
      global->include[uVar15] = (char *)tags->data;
      global->includeshow[uVar15] = iVar10 == 0x1b;
      global->included = global->included + '\x01';
      break;
    case 0x1d:
      global->rightconcat = tags->data != (void *)0x0;
      break;
    case 0x1e:
      global->initialfunc = (char *)tags->data;
      break;
    case 0x1f:
      pcVar8 = (char *)tags->data;
      iVar10 = global->excluded;
      global->excluded = iVar10 + 1;
      global->excludedinit[iVar10] = pcVar8;
      break;
    case 0x20:
      global->outputfunctions = tags->data != (void *)0x0;
      break;
    case 0x21:
      global->webmode = tags->data != (void *)0x0;
      break;
    default:
      EVar13 = WARN_INTERNAL_ERROR;
LAB_00103f07:
      pvVar11 = (void *)0x0;
LAB_00103f09:
      cerror(global,EVar13,pvVar11);
    }
LAB_00103fee:
    tags = tags + 1;
  } while( true );
}

Assistant:

int dooptions(struct Global *global, struct fppTag *tags)
{
  /*
   * dooptions is called to process command line arguments (-Detc).
   * It is called only at cpp startup.
   */
  DEFBUF *dp;
  char end=FALSE; /* end of taglist */

  while(tags && !end) {
    switch(tags->tag) {
    case FPPTAG_END:
      end=TRUE;
      break;
    case FPPTAG_INITFUNC:
      global->initialfunc = (char *) tags->data;
      break;
    case FPPTAG_DISPLAYFUNCTIONS:
      global->outputfunctions = tags->data?1:0;
      break;
    case FPPTAG_RIGHTCONCAT:
      global->rightconcat = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTMAIN:
      global->outputfile = tags->data?1:0;
      break;
    case FPPTAG_NESTED_COMMENTS:
      global->nestcomments = tags->data?1:0;
      break;
    case FPPTAG_WARNMISSINCLUDE:
      global->warnnoinclude = tags->data?1:0;
      break;
    case FPPTAG_WARN_NESTED_COMMENTS:
      global->warnnestcomments =  tags->data?1:0;
      break;
    case FPPTAG_OUTPUTSPACE:
      global->showspace = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTBALANCE:
      global->showbalance = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTINCLUDES:
      global->showincluded = tags->data?1:0;
      break;
    case FPPTAG_IGNOREVERSION:
#ifdef GDLPP
      global->showversion = tags->data?0:1;
#else
      global->showversion = tags->data?1:0;
#endif
      break;
    case FPPTAG_WARNILLEGALCPP:
      global->warnillegalcpp = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTLINE:
      global->outputLINE = tags->data?1:0;
      break;
    case FPPTAG_KEEPCOMMENTS:
      if(tags->data) {
	global->cflag = TRUE;
	global->keepcomments = TRUE;
      }
      break;
    case FPPTAG_DEFINE:
      /*
       * If the option is just "-Dfoo", make it -Dfoo=1
       */
      {
	char *symbol=(char *)tags->data;
	char *text=symbol;
	while (*text != EOS && *text != '=')
	  text++;
	if (*text == EOS)
	  text = "1";
	else
	  *text++ = EOS;
	/*
	 * Now, save the word and its definition.
	 */
	dp = defendel(global, symbol, FALSE);
	if(!dp)
	  return(FPP_OUT_OF_MEMORY);
	dp->repl = savestring(global, text);
	dp->nargs = DEF_NOARGS;
      }
      break;
    case FPPTAG_IGNORE_NONFATAL:
      global->eflag = TRUE;
      break;
    case FPPTAG_INCLUDE_DIR:
      if (global->incend >= &global->incdir[NINCLUDE]) {
	  cfatal(global, FATAL_TOO_MANY_INCLUDE_DIRS);
	  return(FPP_TOO_MANY_INCLUDE_DIRS);
      }
      *global->incend++ = (char *)tags->data;
      break;
    case FPPTAG_INCLUDE_FILE:
    case FPPTAG_INCLUDE_MACRO_FILE:
      if (global->included >= NINCLUDE) {
	  cfatal(global, FATAL_TOO_MANY_INCLUDE_FILES);
	  return(FPP_TOO_MANY_INCLUDE_FILES);
      }
      global->include[global->included] = (char *)tags->data;

      global->includeshow[global->included] =
	  (tags->tag == FPPTAG_INCLUDE_FILE);

      global->included++;
      break;
    case FPPTAG_BUILTINS:
      global->nflag|=(tags->data?NFLAG_BUILTIN:0);
      break;
    case FPPTAG_PREDEFINES:
      global->nflag|=(tags->data?NFLAG_PREDEFINE:0);
      break;
    case FPPTAG_IGNORE_CPLUSPLUS:
      global->cplusplus=!tags->data;
      break;
    case FPPTAG_SIZEOF_TABLE:
      {
	SIZES *sizp;	/* For -S		*/
	int size;	/* For -S		*/
	int isdatum;	/* FALSE for -S*	*/
	int endtest;	/* For -S		*/

	char *text=(char *)tags->data;

	sizp = size_table;
	if ( (isdatum = (*text != '*')) ) /* If it's just -S,     */
	  endtest = T_FPTR;	/* Stop here		*/
	else {			/* But if it's -S*      */
	  text++;		/* Step over '*'        */
	  endtest = 0;		/* Stop at end marker	*/
	}
	while (sizp->bits != endtest && *text != EOS) {
	  if (!isdigit(*text)) {    /* Skip to next digit   */
	    text++;
	    continue;
	  }
	  size = 0;		/* Compile the value	*/
	  while (isdigit(*text)) {
	    size *= 10;
	    size += (*text++ - '0');
	  }
	  if (isdatum)
	    sizp->size = size;	/* Datum size		*/
	  else
	    sizp->psize = size; /* Pointer size 	*/
	  sizp++;
	}
	if (sizp->bits != endtest)
	  cwarn(global, WARN_TOO_FEW_VALUES_TO_SIZEOF, NULL);
	else if (*text != EOS)
	  cwarn(global, WARN_TOO_MANY_VALUES_TO_SIZEOF, NULL);
      }
      break;
    case FPPTAG_UNDEFINE:
      if (defendel(global, (char *)tags->data, TRUE) == NULL)
	cwarn(global, WARN_NOT_DEFINED, tags->data);
      break;
    case FPPTAG_OUTPUT_DEFINES:
      global->wflag++;
      break;
    case FPPTAG_INPUT_NAME:
      strcpy(global->work, tags->data);    /* Remember input filename */
      global->first_file=tags->data;
      break;
    case FPPTAG_INPUT:
      global->input=(char *(*)(char *, int, void *))tags->data;
      break;
    case FPPTAG_OUTPUT:
      global->output=(void (*)(int, void *))tags->data;
      break;      
    case FPPTAG_ERROR:
      global->error=(void (*)(void *, char *, va_list))tags->data;
      break;
    case FPPTAG_USERDATA:
      global->userdata=tags->data;
      break;
    case FPPTAG_LINE:
      global->linelines= tags->data?1:0;
      break;
    case FPPTAG_EXCLFUNC:
      global->excludedinit[ global->excluded++ ] = (char *)tags->data;
      break;
    case FPPTAG_WEBMODE:
      global->webmode=(tags->data?1:0);
      break;
    default:
      cwarn(global, WARN_INTERNAL_ERROR, NULL);
      break;
    }
    tags++;
  }
  return(0);
}